

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_DimStyle *
ON_DimStyle::CreateFromFont
          (ON_Font *font_characteristics,double model_view_text_scale,ON_DimStyle *dimstyle_settings
          ,ON_ComponentManifest *manifest,ON_DimStyle *destination)

{
  bool bVar1;
  wchar_t *pwVar2;
  uint in_stack_ffffffffffffff4c;
  ON_ComponentManifest local_50;
  ON_wString name;
  ON_wString font_description;
  bool bIncludeNotOnDevice;
  ON_DimStyle *local_30;
  ON_DimStyle *destination_local;
  ON_ComponentManifest *manifest_local;
  ON_DimStyle *dimstyle_settings_local;
  double model_view_text_scale_local;
  ON_Font *font_characteristics_local;
  
  model_view_text_scale_local = (double)font_characteristics;
  if (font_characteristics == (ON_Font *)0x0) {
    model_view_text_scale_local = (double)&ON_Font::Default;
  }
  manifest_local = (ON_ComponentManifest *)dimstyle_settings;
  if (dimstyle_settings == (ON_DimStyle *)0x0) {
    manifest_local = (ON_ComponentManifest *)&Default;
  }
  if (destination == (ON_DimStyle *)0x0) {
    local_30 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle(local_30,(ON_DimStyle *)manifest_local);
  }
  else {
    local_30 = destination;
    if (destination != (ON_DimStyle *)manifest_local) {
      operator=(destination,(ON_DimStyle *)manifest_local);
    }
  }
  ON_ModelComponent::ClearModelComponentAttributes(&local_30->super_ON_ModelComponent,0x1ff);
  SetFont(local_30,(ON_Font *)model_view_text_scale_local);
  if ((0.0 < model_view_text_scale) && (bVar1 = ON_IsValid(model_view_text_scale), bVar1)) {
    SetDimScale(local_30,model_view_text_scale);
  }
  ON_Font::Description((ON_Font *)&name,SUB81(model_view_text_scale_local,0),L'\0',L'-',true,true);
  bVar1 = ON_wString::IsNotEmpty(&name);
  if (bVar1) {
    if (manifest == (ON_ComponentManifest *)0x0) {
      ON_wString::ON_wString((ON_wString *)&local_50,&name);
    }
    else {
      pwVar2 = ON_wString::operator_cast_to_wchar_t_(&name);
      ON_ComponentManifest::UnusedName
                (&local_50,(Type)manifest,(ON_UUID)ZEXT816(8),(wchar_t *)(uchar  [8])0x0,pwVar2,
                 (wchar_t *)0x0,0,(uint *)((ulong)in_stack_ffffffffffffff4c << 0x20));
    }
    pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_50);
    ON_ModelComponent::SetName(&local_30->super_ON_ModelComponent,pwVar2);
    ON_wString::~ON_wString((ON_wString *)&local_50);
  }
  ClearAllFieldOverrides(local_30);
  ON_wString::~ON_wString(&name);
  return local_30;
}

Assistant:

ON_DimStyle* ON_DimStyle::CreateFromFont(
  const ON_Font* font_characteristics,
  double model_view_text_scale,
  const ON_DimStyle* dimstyle_settings,
  const class ON_ComponentManifest* manifest,
  ON_DimStyle* destination
)
{
  if (nullptr == font_characteristics)
    font_characteristics = &ON_Font::Default;

  if (nullptr == dimstyle_settings)
  {
    dimstyle_settings = &ON_DimStyle::Default;
  }
  if (nullptr == destination)
    destination = new ON_DimStyle(*dimstyle_settings);
  else 
  {
    if (destination != dimstyle_settings)
      *destination = *dimstyle_settings;
  }

  destination->ClearModelComponentAttributes(ON_ModelComponent::Attributes::AllAttributes);

  destination->SetFont(*font_characteristics);

  if ( model_view_text_scale > 0.0 && ON_IsValid(model_view_text_scale))
    destination->SetDimScale(model_view_text_scale);

  // Dale Lear RH-63824 May 3, 2021
  // It is critical that bIncludeNotOnDevice be set to false.
  // Otherwise missing fonts will have a description beginning with "[Not on device]"
  // and square brackets are not permitted in names.
  // This code is inventing a Rhino 6/7 dimstyle name from a V4 text style.
  // The text style names were unreliable in V4 and we've used the font
  // description as a proxy for years now.
  const bool bIncludeNotOnDevice = false;

  const ON_wString font_description = font_characteristics->Description(ON_Font::NameLocale::LocalizedFirst, ON_wString::HyphenMinus, ON_wString::Space, true, bIncludeNotOnDevice);
  if (font_description.IsNotEmpty())
  {
    const ON_wString name
      = (nullptr != manifest)
      ? manifest->UnusedName(ON_ModelComponent::Type::DimStyle, ON_nil_uuid, font_description, nullptr, nullptr, 0, nullptr)
      : font_description;
    destination->SetName(name);
  }

  // The calls to destination->SetFont() and destination->SetDimScale()
  // set the overrides.
  destination->ClearAllFieldOverrides();

  return destination;
}